

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

void raw_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  _Bool _Var1;
  Raw *raw_00;
  Raw *raw;
  char *error_msg_local;
  PlugCloseType type_local;
  Plug *plug_local;
  
  raw_00 = (Raw *)(plug + -9);
  if (type == PLUGCLOSE_NORMAL) {
    if (((((ulong)plug[-3].vt & 1) == 0) && (_Var1 = seat_eof((Seat *)plug[-6].vt), _Var1)) &&
       (((ulong)plug[-3].vt & 0x100) == 0)) {
      if (raw_00->s != (Socket *)0x0) {
        sk_write_eof(raw_00->s);
      }
      *(undefined1 *)((long)&plug[-3].vt + 1) = 1;
    }
    *(undefined1 *)&plug[-3].vt = 1;
    raw_check_close(raw_00);
  }
  else {
    if (raw_00->s != (Socket *)0x0) {
      sk_close(raw_00->s);
      raw_00->s = (Socket *)0x0;
      *(undefined1 *)&plug[-8].vt = 1;
      seat_notify_remote_exit((Seat *)plug[-6].vt);
      seat_notify_remote_disconnect((Seat *)plug[-6].vt);
    }
    logevent((LogContext *)plug[-5].vt,error_msg);
    if (type != PLUGCLOSE_USER_ABORT) {
      seat_connection_fatal((Seat *)plug[-6].vt,"%s",error_msg);
    }
  }
  return;
}

Assistant:

static void raw_closing(Plug *plug, PlugCloseType type, const char *error_msg)
{
    Raw *raw = container_of(plug, Raw, plug);

    if (type != PLUGCLOSE_NORMAL) {
        /* A socket error has occurred. */
        if (raw->s) {
            sk_close(raw->s);
            raw->s = NULL;
            raw->closed_on_socket_error = true;
            seat_notify_remote_exit(raw->seat);
            seat_notify_remote_disconnect(raw->seat);
        }
        logevent(raw->logctx, error_msg);
        if (type != PLUGCLOSE_USER_ABORT)
            seat_connection_fatal(raw->seat, "%s", error_msg);
    } else {
        /* Otherwise, the remote side closed the connection normally. */
        if (!raw->sent_console_eof && seat_eof(raw->seat)) {
            /*
             * The front end wants us to close the outgoing side of the
             * connection as soon as we see EOF from the far end.
             */
            if (!raw->sent_socket_eof) {
                if (raw->s)
                    sk_write_eof(raw->s);
                raw->sent_socket_eof= true;
            }
        }
        raw->sent_console_eof = true;
        raw_check_close(raw);
    }
}